

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

Aig_Man_t * Saig_ManDupFoldConstrsFunc(Aig_Man_t *pAig,int fCompl,int fVerbose)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_4c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pFlopIn;
  Aig_Obj_t *pFlopOut;
  Aig_Obj_t *pMiter;
  Aig_Man_t *pAigNew;
  int fVerbose_local;
  int fCompl_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ManConstrNum(pAig);
  if (iVar1 == 0) {
    pAig_local = Aig_ManDupDfs(pAig);
  }
  else {
    iVar1 = Aig_ManConstrNum(pAig);
    iVar2 = Saig_ManPoNum(pAig);
    if (iVar2 <= iVar1) {
      __assert_fail("Aig_ManConstrNum(pAig) < Saig_ManPoNum(pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigConstr2.c"
                    ,0x3b5,"Aig_Man_t *Saig_ManDupFoldConstrsFunc(Aig_Man_t *, int, int)");
    }
    iVar1 = Aig_ManNodeNum(pAig);
    pAig_local = Aig_ManStart(iVar1);
    pcVar3 = Abc_UtilStrsav(pAig->pName);
    pAig_local->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(pAig->pSpec);
    pAig_local->pSpec = pcVar3;
    pAVar4 = Aig_ManConst1(pAig_local);
    pAVar5 = Aig_ManConst1(pAig);
    (pAVar5->field_5).pData = pAVar4;
    for (local_4c = 0; iVar1 = Vec_PtrSize(pAig->vCis), local_4c < iVar1; local_4c = local_4c + 1) {
      pvVar6 = Vec_PtrEntry(pAig->vCis,local_4c);
      pAVar4 = Aig_ObjCreateCi(pAig_local);
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
    }
    for (local_4c = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_4c < iVar1; local_4c = local_4c + 1)
    {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_4c);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
        pAVar5 = Aig_ObjChild0Copy(pAVar4);
        p1 = Aig_ObjChild1Copy(pAVar4);
        pAVar5 = Aig_And(pAig_local,pAVar5,p1);
        (pAVar4->field_5).pData = pAVar5;
      }
    }
    pFlopOut = Aig_ManConst0(pAig_local);
    for (local_4c = 0; iVar1 = Saig_ManPoNum(pAig), local_4c < iVar1; local_4c = local_4c + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_4c);
      iVar1 = Saig_ManPoNum(pAig);
      iVar2 = Aig_ManConstrNum(pAig);
      if (iVar1 - iVar2 <= local_4c) {
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        pAVar4 = Aig_NotCond(pAVar4,fCompl);
        pFlopOut = Aig_Or(pAig_local,pFlopOut,pAVar4);
      }
    }
    iVar1 = Saig_ManRegNum(pAig);
    if (iVar1 < 1) {
      pObj = pFlopOut;
    }
    else {
      pAVar4 = Aig_ObjCreateCi(pAig_local);
      pObj = Aig_Or(pAig_local,pFlopOut,pAVar4);
    }
    for (local_4c = 0; iVar1 = Saig_ManPoNum(pAig), local_4c < iVar1; local_4c = local_4c + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_4c);
      iVar1 = Saig_ManPoNum(pAig);
      iVar2 = Aig_ManConstrNum(pAig);
      if (local_4c < iVar1 - iVar2) {
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        pAVar5 = Aig_Not(pObj);
        pAVar4 = Aig_And(pAig_local,pAVar4,pAVar5);
        Aig_ObjCreateCo(pAig_local,pAVar4);
      }
    }
    for (local_4c = 0; iVar1 = Saig_ManRegNum(pAig), local_4c < iVar1; local_4c = local_4c + 1) {
      p = pAig->vCos;
      iVar1 = Saig_ManPoNum(pAig);
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p,local_4c + iVar1);
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      Aig_ObjCreateCo(pAig_local,pAVar4);
    }
    iVar1 = Saig_ManRegNum(pAig);
    if (0 < iVar1) {
      Aig_ObjCreateCo(pAig_local,pObj);
      iVar1 = Aig_ManRegNum(pAig);
      Aig_ManSetRegNum(pAig_local,iVar1 + 1);
    }
    Aig_ManCleanup(pAig_local);
    Aig_ManSeqCleanup(pAig_local);
  }
  return pAig_local;
}

Assistant:

Aig_Man_t * Saig_ManDupFoldConstrsFunc( Aig_Man_t * pAig, int fCompl, int fVerbose )
{
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pMiter, * pFlopOut, * pFlopIn, * pObj;
    int i;
    if ( Aig_ManConstrNum(pAig) == 0 )
        return Aig_ManDupDfs( pAig );
    assert( Aig_ManConstrNum(pAig) < Saig_ManPoNum(pAig) );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );

    // OR the constraint outputs
    pMiter = Aig_ManConst0( pAigNew );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i < Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
            continue;
        pMiter = Aig_Or( pAigNew, pMiter, Aig_NotCond( Aig_ObjChild0Copy(pObj), fCompl ) );
    }

    // create additional flop
    if ( Saig_ManRegNum(pAig) > 0 )
    {
        pFlopOut = Aig_ObjCreateCi( pAigNew );
        pFlopIn  = Aig_Or( pAigNew, pMiter, pFlopOut );
    }
    else 
        pFlopIn = pMiter;

    // create primary output
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i >= Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
            continue;
        pMiter = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_Not(pFlopIn) );
        Aig_ObjCreateCo( pAigNew, pMiter );
    }

    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );

    // create additional flop 
    if ( Saig_ManRegNum(pAig) > 0 )
    {
        Aig_ObjCreateCo( pAigNew, pFlopIn );
        Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig)+1 );
    }

    // perform cleanup
    Aig_ManCleanup( pAigNew );
    Aig_ManSeqCleanup( pAigNew );
    return pAigNew;
}